

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

bool __thiscall QFSFileEnginePrivate::doStat(QFSFileEnginePrivate *this,MetaDataFlags flags)

{
  bool bVar1;
  int fd;
  
  if (((this->field_0xc2 & 4) == 0) ||
     (((uint)flags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
      ~(this->metaData).knownFlagsMask.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i) != 0)) {
    this->field_0xc2 = this->field_0xc2 | 4;
    fd = this->fd;
    if (this->fh != (FILE *)0x0) {
      bVar1 = QFileSystemEntry::isEmpty(&this->fileEntry);
      if (bVar1) {
        fd = fileno((FILE *)this->fh);
      }
    }
    if (fd != -1) {
      QFileSystemEngine::fillMetaData(fd,&this->metaData);
    }
    if ((~(this->metaData).knownFlagsMask.
          super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
        (uint)flags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
              super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i) != 0) {
      bVar1 = QFileSystemEntry::isEmpty(&this->fileEntry);
      if (!bVar1) {
        QFileSystemEngine::fillMetaData
                  (&this->fileEntry,&this->metaData,
                   (MetaDataFlags)
                   (~(this->metaData).knownFlagsMask.
                     super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                     super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
                   (uint)flags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i));
      }
    }
  }
  return (bool)((*(byte *)((long)&(this->metaData).entryFlags.
                                  super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2) &
                0x40) >> 6);
}

Assistant:

bool QFSFileEnginePrivate::doStat(QFileSystemMetaData::MetaDataFlags flags) const
{
    if (!tried_stat || !metaData.hasFlags(flags)) {
        tried_stat = 1;

        int localFd = fd;
        if (fh && fileEntry.isEmpty())
            localFd = QT_FILENO(fh);
        if (localFd != -1)
            QFileSystemEngine::fillMetaData(localFd, metaData);

        if (metaData.missingFlags(flags) && !fileEntry.isEmpty())
            QFileSystemEngine::fillMetaData(fileEntry, metaData, metaData.missingFlags(flags));
    }

    return metaData.exists();
}